

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MasterTable.h
# Opt level: O3

ion_err_t __thiscall
MasterTable::openDictionary<int,int>
          (MasterTable *this,Dictionary<int,_int> *dictionary,ion_dictionary_id_t id)

{
  ion_err_t iVar1;
  ion_err_t iVar2;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t local_58;
  ion_dictionary_config_info_t local_38;
  
  iVar1 = ion_lookup_in_master_table(id,&local_58);
  iVar2 = '\x12';
  if (iVar1 == '\0') {
    iVar2 = ion_switch_handler(local_58.dictionary_type,&this->handler);
    if (iVar2 == '\0') {
      (dictionary->dict).handler = &this->handler;
      local_38.value_size = local_58.value_size;
      local_38.dictionary_size = local_58.dictionary_size;
      local_38.id = local_58.id;
      local_38.use_type = local_58.use_type;
      local_38._5_3_ = local_58._5_3_;
      local_38.type = local_58.type;
      local_38.key_size = local_58.key_size;
      iVar2 = dictionary_open(&dictionary->handler,&dictionary->dict,&local_38);
      dictionary->key_type = local_38.type;
      dictionary->key_size = local_38.key_size;
      dictionary->value_size = local_38.value_size;
      dictionary->dict_size = local_38.dictionary_size;
      (dictionary->last_status).error = iVar2;
    }
  }
  return iVar2;
}

Assistant:

ion_err_t
openDictionary(
	Dictionary<K, V>	*dictionary,
	ion_dictionary_id_t id
) {
	ion_err_t						err;
	ion_dictionary_config_info_t	config;

	err = ion_lookup_in_master_table(id, &config);

	/* Lookup for id failed. */
	if (err_ok != err) {
		return err_uninitialized;
	}

	err = ion_switch_handler(config.dictionary_type, &handler);

	if (err_ok != err) {
		return err;
	}

	dictionary->dict.handler	= &handler;

	err							= dictionary->open(config);

	return err;
}